

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O3

bool __thiscall QMimeGlobPattern::matchFileName(QMimeGlobPattern *this,QString *inputFileName)

{
  char16_t cVar1;
  storage_type_conflict *psVar2;
  bool bVar3;
  Category CVar4;
  CutResult CVar5;
  storage_type_conflict *psVar6;
  storage_type_conflict *psVar7;
  char16_t *pcVar8;
  qsizetype qVar9;
  char16_t *pcVar10;
  char *pcVar11;
  char32_t ucs4;
  long lVar12;
  qsizetype qVar13;
  long in_FS_OFFSET;
  QStringView rhs;
  QStringView rhs_00;
  QStringView QVar14;
  QStringView lhs;
  QLatin1StringView lhs_00;
  QRegularExpression rx;
  undefined1 local_58 [24];
  char16_t *pcStack_40;
  storage_type_conflict *local_38;
  QRegularExpressionMatch local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pcStack_40 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if (this->m_caseSensitivity == CaseInsensitive) {
    QString::toLower_helper((QString *)(local_58 + 0x10),inputFileName);
  }
  else {
    local_58._16_8_ = (inputFileName->d).d;
    pcStack_40 = (inputFileName->d).ptr;
    local_38 = (storage_type_conflict *)(inputFileName->d).size;
    if ((QArrayData *)local_58._16_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_58._16_8_)->ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((QArrayData *)local_58._16_8_)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  psVar7 = local_38;
  pcVar8 = pcStack_40;
  psVar2 = (storage_type_conflict *)(this->m_pattern).d.size;
  if (psVar2 != (storage_type_conflict *)0x0) {
    switch(this->m_patternType) {
    case SuffixPattern:
      if (psVar2 <= (storage_type_conflict *)((long)local_38 + 1)) {
        psVar7 = (storage_type_conflict *)0x1;
        if (psVar2 != (storage_type_conflict *)0x1) {
          if (pcStack_40 == (char16_t *)0x0) {
            pcVar8 = &QString::_empty;
          }
          pcVar10 = (this->m_pattern).d.ptr;
          if (pcVar10 == (char16_t *)0x0) {
            pcVar10 = &QString::_empty;
          }
          psVar6 = (storage_type_conflict *)0x1;
          lVar12 = -2;
          do {
            psVar7 = psVar6;
            if (*(short *)((long)pcVar10 + lVar12 + (long)psVar2 * 2) !=
                *(short *)((long)pcVar8 + lVar12 + (long)local_38 * 2)) break;
            psVar6 = (storage_type_conflict *)((long)psVar6 + 1);
            lVar12 = lVar12 + -2;
            psVar7 = psVar2;
          } while (psVar2 != psVar6);
        }
LAB_004a4d95:
        bVar3 = psVar2 == psVar7;
        goto LAB_004a4cb9;
      }
      break;
    case PrefixPattern:
      if (psVar2 <= (storage_type_conflict *)((long)local_38 + 1)) {
        psVar7 = (storage_type_conflict *)0x1;
        if (psVar2 != (storage_type_conflict *)0x1) {
          if (pcStack_40 == (char16_t *)0x0) {
            pcVar8 = &QString::_empty;
          }
          pcVar10 = (this->m_pattern).d.ptr;
          if (pcVar10 == (char16_t *)0x0) {
            pcVar10 = &QString::_empty;
          }
          psVar6 = (storage_type_conflict *)0x1;
          do {
            psVar7 = psVar6;
            if (pcVar10[(long)((long)psVar6 + -1)] != pcVar8[(long)((long)psVar6 + -1)]) break;
            psVar6 = (storage_type_conflict *)((long)psVar6 + 1);
            psVar7 = psVar2;
          } while (psVar2 != psVar6);
        }
        goto LAB_004a4d95;
      }
      break;
    case LiteralPattern:
      if (psVar2 == local_38) {
        rhs.m_data = pcStack_40;
        rhs.m_size = (qsizetype)psVar2;
        lhs.m_data = (this->m_pattern).d.ptr;
        lhs.m_size = (qsizetype)psVar2;
        bVar3 = QtPrivate::equalStrings(lhs,rhs);
        goto LAB_004a4cb9;
      }
      break;
    case VdrPattern:
      if ((((local_38 == (storage_type_conflict *)&DAT_00000007) &&
           ((cVar1 = *pcStack_40, (ushort)cVar1 - 0x30 < 10 ||
            ((0x7f < (ushort)cVar1 &&
             (CVar4 = QChar::category((uint)(ushort)cVar1), CVar4 == Number_DecimalDigit)))))) &&
          ((cVar1 = pcVar8[1], (ushort)cVar1 - 0x30 < 10 ||
           ((0x7f < (ushort)cVar1 &&
            (CVar4 = QChar::category((uint)(ushort)cVar1), CVar4 == Number_DecimalDigit)))))) &&
         ((cVar1 = pcVar8[2], (ushort)cVar1 - 0x30 < 10 ||
          ((0x7f < (ushort)cVar1 &&
           (CVar4 = QChar::category((uint)(ushort)cVar1), CVar4 == Number_DecimalDigit)))))) {
        local_58._0_8_ = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x7;
        local_58._8_8_ = pcVar8;
        QVar14 = QStringView::mid((QStringView *)local_58,3,4);
        pcVar8 = QVar14.m_data;
        if (QVar14.m_size == 4) {
          pcVar11 = ".vdr";
          qVar13 = 4;
          qVar9 = 4;
LAB_004a4e4c:
          rhs_00.m_data = pcVar8;
          rhs_00.m_size = qVar9;
          lhs_00.m_data = pcVar11;
          lhs_00.m_size = qVar13;
          bVar3 = QtPrivate::equalStrings(lhs_00,rhs_00);
          goto LAB_004a4cb9;
        }
      }
      break;
    case AnimPattern:
      if ((storage_type_conflict *)0x5 < local_38) {
        ucs4 = (char32_t)(ushort)pcStack_40[(long)((long)local_38 + -1)];
        if ((ushort)pcStack_40[(long)((long)local_38 + -1)] - 0x30 < 10) {
          if (ucs4 != L'0') goto LAB_004a4dff;
        }
        else if ((uint)ucs4 < 0x80) {
          if (ucs4 == L'j') goto LAB_004a4dff;
        }
        else {
          CVar4 = QChar::category(ucs4);
          if (CVar4 == Number_DecimalDigit) {
LAB_004a4dff:
            local_58._0_8_ = psVar7 + -3;
            local_28.d.d.ptr =
                 (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                 (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)0x5;
            CVar5 = QtPrivate::QContainerImplHelper::mid
                              ((qsizetype)psVar7,(qsizetype *)local_58,(qsizetype *)&local_28);
            bVar3 = false;
            if ((CVar5 == Null) ||
               (local_28.d.d.ptr != (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)0x5))
            goto LAB_004a4cb9;
            pcVar8 = pcVar8 + local_58._0_8_;
            pcVar11 = ".anim";
            qVar13 = 5;
            qVar9 = 5;
            goto LAB_004a4e4c;
          }
        }
      }
      break;
    case OtherPattern:
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QVar14.m_data = psVar2;
      QVar14.m_size = (qsizetype)local_58;
      QRegularExpression::fromWildcard
                (QVar14,(CaseSensitivity)(this->m_pattern).d.ptr,(WildcardConversionOptions)0x0);
      QRegularExpression::match
                ((QRegularExpression *)&local_28,(QString *)local_58,(qsizetype)(local_58 + 0x10),
                 NormalMatch,(MatchOptions)0x0);
      bVar3 = QRegularExpressionMatch::hasMatch(&local_28);
      QRegularExpressionMatch::~QRegularExpressionMatch(&local_28);
      QRegularExpression::~QRegularExpression((QRegularExpression *)local_58);
      goto LAB_004a4cb9;
    }
  }
  bVar3 = false;
LAB_004a4cb9:
  if ((QArrayData *)local_58._16_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._16_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._16_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QMimeGlobPattern::matchFileName(const QString &inputFileName) const
{
    // "Applications MUST match globs case-insensitively, except when the case-sensitive
    // attribute is set to true."
    // The constructor takes care of putting case-insensitive patterns in lowercase.
    const QString fileName = m_caseSensitivity == Qt::CaseInsensitive
            ? inputFileName.toLower() : inputFileName;

    const qsizetype patternLength = m_pattern.size();
    if (!patternLength)
        return false;
    const qsizetype fileNameLength = fileName.size();

    switch (m_patternType) {
    case SuffixPattern: {
        if (fileNameLength + 1 < patternLength)
            return false;

        const QChar *c1 = m_pattern.unicode() + patternLength - 1;
        const QChar *c2 = fileName.unicode() + fileNameLength - 1;
        int cnt = 1;
        while (cnt < patternLength && *c1-- == *c2--)
            ++cnt;
        return cnt == patternLength;
    }
    case PrefixPattern: {
        if (fileNameLength + 1 < patternLength)
            return false;

        const QChar *c1 = m_pattern.unicode();
        const QChar *c2 = fileName.unicode();
        int cnt = 1;
        while (cnt < patternLength && *c1++ == *c2++)
           ++cnt;
        return cnt == patternLength;
    }
    case LiteralPattern:
        return (m_pattern == fileName);
    case VdrPattern: // "[0-9][0-9][0-9].vdr" case
        return fileNameLength == 7
                && fileName.at(0).isDigit() && fileName.at(1).isDigit() && fileName.at(2).isDigit()
                && QStringView{fileName}.mid(3, 4) == ".vdr"_L1;
    case AnimPattern: { // "*.anim[1-9j]" case
        if (fileNameLength < 6)
            return false;
        const QChar lastChar = fileName.at(fileNameLength - 1);
        const bool lastCharOK = (lastChar.isDigit() && lastChar != u'0')
                              || lastChar == u'j';
        return lastCharOK && QStringView{fileName}.mid(fileNameLength - 6, 5) == ".anim"_L1;
    }
    case OtherPattern:
        // Other fallback patterns: slow but correct method
#if QT_CONFIG(regularexpression)
        auto rx = QRegularExpression::fromWildcard(m_pattern);
        return rx.match(fileName).hasMatch();
#else
        return false;
#endif
    }
    return false;
}